

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::ScrollTo(Element *this,Vector2f offset,ScrollBehavior behavior)

{
  Vector2f delta_offset;
  Context *this_00;
  float fStack_24;
  
  fStack_24 = offset.y;
  if (behavior != Instant) {
    this_00 = GetContext(this);
    if (this_00 != (Context *)0x0) {
      delta_offset.y = fStack_24 - (this->scroll_offset).y;
      delta_offset.x = offset.x - (this->scroll_offset).x;
      Context::PerformSmoothscrollOnTarget(this_00,this,delta_offset,behavior);
      return;
    }
  }
  SetScrollLeft(this,offset.x);
  SetScrollTop(this,fStack_24);
  return;
}

Assistant:

void Element::ScrollTo(Vector2f offset, ScrollBehavior behavior)
{
	if (behavior != ScrollBehavior::Instant)
	{
		if (Context* context = GetContext())
		{
			context->PerformSmoothscrollOnTarget(this, offset - scroll_offset, behavior);
			return;
		}
	}

	SetScrollLeft(offset.x);
	SetScrollTop(offset.y);
}